

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

GLenum gl4cts::TextureViewUtilities::getGLFormatOfInternalformat(GLenum internalformat)

{
  uint uVar1;
  TestError *this;
  
  if ((int)internalformat < 0x8d62) {
    if ((int)internalformat < 0x8814) {
      switch(internalformat) {
      case 0x8229:
      case 0x822a:
      case 0x822d:
      case 0x822e:
switchD_00a2964e_caseD_9276:
        return 0x1903;
      case 0x822b:
      case 0x822c:
      case 0x822f:
      case 0x8230:
switchD_00a2964e_caseD_9276:
        return 0x8227;
      case 0x8231:
      case 0x8232:
      case 0x8233:
      case 0x8234:
      case 0x8235:
      case 0x8236:
        return 0x8d94;
      case 0x8237:
      case 0x8238:
      case 0x8239:
      case 0x823a:
      case 0x823b:
      case 0x823c:
        return 0x8228;
      default:
        uVar1 = internalformat - 0x8051;
        if (uVar1 < 0xb) {
          if ((0x5e0U >> (uVar1 & 0x1f) & 1) != 0) {
            return 0x1908;
          }
          if ((9U >> (uVar1 & 0x1f) & 1) != 0) {
            return 0x1907;
          }
        }
        if (internalformat - 0x81a5 < 2) {
          return 0x1902;
        }
      }
    }
    else if ((int)internalformat < 0x8c3a) {
      switch(internalformat) {
      case 0x8814:
      case 0x881a:
        goto switchD_00a2964e_caseD_9276;
      case 0x8815:
      case 0x881b:
        goto switchD_00a2964e_caseD_9276;
      case 0x8816:
      case 0x8817:
      case 0x8818:
      case 0x8819:
        break;
      default:
        if (internalformat == 0x88f0) {
          return 0x84f9;
        }
      }
    }
    else {
      switch(internalformat) {
      case 0x8c3a:
      case 0x8c3d:
      case 0x8c41:
switchD_00a2964e_caseD_9276:
        return 0x1907;
      case 0x8c3b:
      case 0x8c3c:
      case 0x8c3e:
      case 0x8c3f:
      case 0x8c40:
      case 0x8c42:
        break;
      case 0x8c43:
switchD_00a2964e_caseD_9276:
        return 0x1908;
      default:
        if (internalformat == 0x8cac) {
          return 0x1902;
        }
        if (internalformat == 0x8cad) {
          return 0x84f9;
        }
      }
    }
  }
  else if ((int)internalformat < 0x8e8e) {
    if ((int)internalformat < 0x8d88) {
      if (0x8d76 < (int)internalformat) {
        if ((int)internalformat < 0x8d7d) {
          if (internalformat != 0x8d77) {
            if (internalformat == 0x8d7c) {
              return 0x8d99;
            }
            goto switchD_00a2962f_caseD_8c3b;
          }
        }
        else if (internalformat != 0x8d7d) {
          if (internalformat == 0x8d82) {
            return 0x8d99;
          }
          if (internalformat != 0x8d83) goto switchD_00a2962f_caseD_8c3b;
        }
switchD_00a2964e_caseD_9276:
        return 0x8d98;
      }
      if ((int)internalformat < 0x8d71) {
        if (internalformat == 0x8d62) {
          return 0x1907;
        }
        if (internalformat == 0x8d70) {
          return 0x8d99;
        }
      }
      else {
        if (internalformat == 0x8d71) {
          return 0x8d98;
        }
        if (internalformat == 0x8d76) {
          return 0x8d99;
        }
      }
    }
    else if ((int)internalformat < 0x8dbd) {
      switch(internalformat) {
      case 0x8d88:
      case 0x8d8e:
        return 0x8d99;
      case 0x8d89:
      case 0x8d8f:
        goto switchD_00a2964e_caseD_9276;
      case 0x8d8a:
      case 0x8d8b:
      case 0x8d8c:
      case 0x8d8d:
        break;
      default:
        if (internalformat - 0x8dbb < 2) {
          return 0x8225;
        }
      }
    }
    else {
      if (internalformat - 0x8dbd < 2) {
        return 0x8226;
      }
      if (internalformat - 0x8e8c < 2) {
        return 0x84ee;
      }
    }
  }
  else if ((int)internalformat < 0x9270) {
    switch(internalformat) {
    case 0x8f94:
    case 0x8f98:
      goto switchD_00a2964e_caseD_9276;
    case 0x8f95:
    case 0x8f99:
      goto switchD_00a2964e_caseD_9276;
    case 0x8f96:
    case 0x8f9a:
      goto switchD_00a2964e_caseD_9276;
    case 0x8f97:
    case 0x8f9b:
      goto switchD_00a2964e_caseD_9276;
    default:
      if (internalformat - 0x8e8e < 2) {
        return 0x84ed;
      }
      if (internalformat == 0x906f) {
        return 0x8d99;
      }
    }
  }
  else {
    switch(internalformat) {
    case 0x9270:
    case 0x9271:
      return 0x8225;
    case 0x9272:
    case 0x9273:
      return 0x8226;
    case 0x9274:
    case 0x9275:
      return 0x84ed;
    case 0x9276:
    case 0x9277:
    case 0x9278:
    case 0x9279:
      return 0x84ee;
    }
  }
switchD_00a2962f_caseD_8c3b:
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Unrecognized internalformat",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
             ,0x41f);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

glw::GLenum TextureViewUtilities::getGLFormatOfInternalformat(const glw::GLenum internalformat)
{
	glw::GLenum result = FORMAT_UNDEFINED;

	switch (internalformat)
	{
	case GL_COMPRESSED_RGBA_BPTC_UNORM:
	case GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2:
	case GL_COMPRESSED_RGBA8_ETC2_EAC:
	case GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM:
	case GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC:
	case GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2:
	{
		result = GL_COMPRESSED_RGBA;

		break;
	}

	case GL_RGB10_A2:
	case GL_RGB5_A1:
	case GL_RGBA16:
	case GL_RGBA16F:
	case GL_RGBA16_SNORM:
	case GL_RGBA32F:
	case GL_RGBA4:
	case GL_RGBA8:
	case GL_RGBA8_SNORM:
	case GL_SRGB8_ALPHA8:
	{
		result = GL_RGBA;

		break;
	}

	case GL_RGB10_A2UI:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA32I:
	case GL_RGBA32UI:
	case GL_RGBA8I:
	case GL_RGBA8UI:
	{
		result = GL_RGBA_INTEGER;

		break;
	}

	case GL_COMPRESSED_RGB8_ETC2:
	case GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT:
	case GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT:
	case GL_COMPRESSED_SRGB8_ETC2:
	{
		result = GL_COMPRESSED_RGB;

		break;
	}

	case GL_R11F_G11F_B10F:
	case GL_RGB16:
	case GL_RGB16_SNORM:
	case GL_RGB16F:
	case GL_RGB32F:
	case GL_RGB565:
	case GL_RGB8:
	case GL_RGB8_SNORM:
	case GL_RGB9_E5:
	case GL_SRGB8:
	{
		result = GL_RGB;

		break;
	}

	case GL_RGB16I:
	case GL_RGB16UI:
	case GL_RGB32I:
	case GL_RGB32UI:
	case GL_RGB8I:
	case GL_RGB8UI:
	{
		result = GL_RGB_INTEGER;

		break;
	}

	case GL_COMPRESSED_RG_RGTC2:
	case GL_COMPRESSED_RG11_EAC:
	case GL_COMPRESSED_SIGNED_RG_RGTC2:
	case GL_COMPRESSED_SIGNED_RG11_EAC:
	{
		result = GL_COMPRESSED_RG;

		break;
	}

	case GL_RG16:
	case GL_RG16_SNORM:
	case GL_RG16F:
	case GL_RG32F:
	case GL_RG8:
	case GL_RG8_SNORM:
	{
		result = GL_RG;

		break;
	}

	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG32I:
	case GL_RG32UI:
	case GL_RG8I:
	case GL_RG8UI:
	{
		result = GL_RG_INTEGER;

		break;
	}

	case GL_COMPRESSED_R11_EAC:
	case GL_COMPRESSED_RED_RGTC1:
	case GL_COMPRESSED_SIGNED_R11_EAC:
	case GL_COMPRESSED_SIGNED_RED_RGTC1:
	{
		result = GL_COMPRESSED_RED;

		break;
	}

	case GL_R16:
	case GL_R16F:
	case GL_R16_SNORM:
	case GL_R32F:
	case GL_R8:
	case GL_R8_SNORM:
	{
		result = GL_RED;

		break;
	}

	case GL_R16I:
	case GL_R16UI:
	case GL_R32I:
	case GL_R32UI:
	case GL_R8I:
	case GL_R8UI:
	{
		result = GL_RED_INTEGER;

		break;
	}

	case GL_DEPTH_COMPONENT16:
	case GL_DEPTH_COMPONENT24:
	case GL_DEPTH_COMPONENT32F:
	{
		result = GL_DEPTH_COMPONENT;

		break;
	}

	case GL_DEPTH24_STENCIL8:
	case GL_DEPTH32F_STENCIL8:
	{
		result = GL_DEPTH_STENCIL;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized internalformat");
	}
	} /* switch (internalformat) */

	return result;
}